

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Local.cpp
# Opt level: O0

Point Local::moves_fast_match
                (set<Point,_std::less<Point>,_std::allocator<Point>_> *options,char input,
                bool *reselect,bool get)

{
  size_t *psVar1;
  char cVar2;
  bool bVar3;
  dimension dVar4;
  int iVar5;
  size_type sVar6;
  pointer pPVar7;
  ostream *poVar8;
  reference pPVar9;
  insert_iterator<std::set<Point,_std::less<Point>,_std::allocator<Point>_>_> iVar10;
  anon_class_16_2_2bfbb272 __pred;
  _Rb_tree_const_iterator<Point> local_168;
  insert_iterator<std::set<Point,_std::less<Point>,_std::allocator<Point>_>_> local_160;
  uint local_150;
  bool *local_148;
  _Base_ptr local_140;
  insert_iterator<std::set<Point,_std::less<Point>,_std::allocator<Point>_>_> local_138;
  _Rb_tree_const_iterator<Point> local_128;
  _Rb_tree_const_iterator<Point> local_120;
  _Rb_tree_const_iterator<Point> local_118;
  _Rb_tree_const_iterator<Point> local_110;
  _Rb_tree_const_iterator<Point> local_108;
  bool local_f9;
  undefined1 auStack_f8 [7];
  bool first_char;
  _Iter local_f0;
  char local_e1;
  _Base_ptr local_e0;
  insert_iterator<std::set<Point,_std::less<Point>,_std::allocator<Point>_>_> local_d8;
  _Rb_tree_const_iterator<Point> local_c8;
  _Rb_tree_const_iterator<Point> local_c0;
  undefined4 local_b8;
  undefined1 local_a8 [8];
  set<Point,_std::less<Point>,_std::allocator<Point>_> final_matches;
  set<Point,_std::less<Point>,_std::allocator<Point>_> matches;
  _Rb_tree_const_iterator<Point> local_40;
  _Rb_tree_const_iterator<Point> local_38;
  byte local_29;
  bool *pbStack_28;
  bool get_local;
  bool *reselect_local;
  set<Point,_std::less<Point>,_std::allocator<Point>_> *psStack_18;
  char input_local;
  set<Point,_std::less<Point>,_std::allocator<Point>_> *options_local;
  
  *reselect = false;
  local_29 = get;
  pbStack_28 = reselect;
  reselect_local._7_1_ = input;
  psStack_18 = options;
  sVar6 = std::set<Point,_std::less<Point>,_std::allocator<Point>_>::size(options);
  if (sVar6 == 1) {
    local_38._M_node =
         (_Base_ptr)std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin(psStack_18);
    pPVar7 = std::_Rb_tree_const_iterator<Point>::operator->(&local_38);
    dVar4 = Point::get_x(pPVar7);
    poVar8 = std::operator<<((ostream *)&std::cout,(char)dVar4 + 'a');
    local_40._M_node =
         (_Base_ptr)std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin(psStack_18);
    pPVar7 = std::_Rb_tree_const_iterator<Point>::operator->(&local_40);
    dVar4 = Point::get_y(pPVar7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,dVar4 + 1);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    matches._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin(psStack_18);
    pPVar9 = std::_Rb_tree_const_iterator<Point>::operator*
                       ((_Rb_tree_const_iterator<Point> *)
                        &matches._M_t._M_impl.super__Rb_tree_header._M_node_count);
    options_local._4_4_ = *pPVar9;
  }
  else {
    std::set<Point,_std::less<Point>,_std::allocator<Point>_>::set
              ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)
               &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<Point,_std::less<Point>,_std::allocator<Point>_>::set
              ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_a8);
    do {
      do {
        if ((local_29 & 1) != 0) {
          cVar2 = getch();
          iVar5 = tolower((int)cVar2);
          reselect_local._7_1_ = (char)iVar5;
        }
        local_29 = 1;
        iVar5 = isspace((int)reselect_local._7_1_);
      } while (iVar5 != 0);
      if (reselect_local._7_1_ == 'u') {
        poVar8 = std::operator<<((ostream *)&std::cout,'u');
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        *pbStack_28 = true;
        Point::Point((Point *)((long)&options_local + 4),-1,-1);
        goto LAB_0012cdfd;
      }
      local_c0._M_node =
           (_Base_ptr)std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin(psStack_18);
      local_c8._M_node =
           (_Base_ptr)std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end(psStack_18);
      psVar1 = &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_e0 = (_Base_ptr)
                 std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end
                           ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)psVar1);
      iVar10 = std::inserter<std::set<Point,std::less<Point>,std::allocator<Point>>>
                         ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)psVar1,
                          (iterator)local_e0);
      local_e1 = reselect_local._7_1_;
      local_d8 = iVar10;
      iVar10 = std::
               copy_if<std::_Rb_tree_const_iterator<Point>,std::insert_iterator<std::set<Point,std::less<Point>,std::allocator<Point>>>,Local::moves_fast_match(std::set<Point,std::less<Point>,std::allocator<Point>>const&,char,bool&,bool)::__0>
                         (local_c0,local_c8,iVar10,reselect_local._7_1_);
      _auStack_f8 = iVar10;
      bVar3 = std::set<Point,_std::less<Point>,_std::allocator<Point>_>::empty
                        ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)
                         &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count);
    } while (bVar3);
    iVar5 = isalpha((int)reselect_local._7_1_);
    local_f9 = iVar5 != 0;
    std::operator<<((ostream *)&std::cout,reselect_local._7_1_);
    sVar6 = std::set<Point,_std::less<Point>,_std::allocator<Point>_>::size
                      ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)
                       &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (sVar6 == 1) {
      iVar5 = isalpha((int)reselect_local._7_1_);
      if (iVar5 == 0) {
        local_110._M_node =
             (_Base_ptr)
             std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin
                       ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)
                        &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pPVar7 = std::_Rb_tree_const_iterator<Point>::operator->(&local_110);
        dVar4 = Point::get_x(pPVar7);
        cVar2 = (char)dVar4 + 'a';
      }
      else {
        local_108._M_node =
             (_Base_ptr)
             std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin
                       ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)
                        &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pPVar7 = std::_Rb_tree_const_iterator<Point>::operator->(&local_108);
        dVar4 = Point::get_y(pPVar7);
        cVar2 = (char)dVar4 + '1';
      }
      poVar8 = std::operator<<((ostream *)&std::cout,cVar2);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      local_118._M_node =
           (_Base_ptr)
           std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin
                     ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)
                      &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pPVar9 = std::_Rb_tree_const_iterator<Point>::operator*(&local_118);
      options_local._4_4_ = *pPVar9;
    }
    else {
      do {
        std::set<Point,_std::less<Point>,_std::allocator<Point>_>::clear
                  ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_a8);
        do {
          cVar2 = getch();
          iVar5 = tolower((int)cVar2);
          reselect_local._7_1_ = (char)iVar5;
          iVar5 = isspace((int)reselect_local._7_1_);
        } while (iVar5 != 0);
        if (reselect_local._7_1_ == 'u') {
          poVar8 = std::operator<<((ostream *)&std::cout,'u');
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          *pbStack_28 = true;
          Point::Point((Point *)((long)&options_local + 4),-1,-1);
          goto LAB_0012cdfd;
        }
        psVar1 = &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_120._M_node =
             (_Base_ptr)
             std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin
                       ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)psVar1);
        local_128._M_node =
             (_Base_ptr)
             std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end
                       ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)psVar1);
        local_140 = (_Base_ptr)
                    std::set<Point,_std::less<Point>,_std::allocator<Point>_>::end
                              ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_a8);
        iVar10 = std::inserter<std::set<Point,std::less<Point>,std::allocator<Point>>>
                           ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_a8,
                            (iterator)local_140);
        local_150 = CONCAT31(local_150._1_3_,reselect_local._7_1_);
        local_148 = &local_f9;
        __pred._4_4_ = 0;
        __pred._0_4_ = local_150;
        __pred.first_char = local_148;
        local_138 = iVar10;
        iVar10 = std::
                 copy_if<std::_Rb_tree_const_iterator<Point>,std::insert_iterator<std::set<Point,std::less<Point>,std::allocator<Point>>>,Local::moves_fast_match(std::set<Point,std::less<Point>,std::allocator<Point>>const&,char,bool&,bool)::__1>
                           (local_120,local_128,iVar10,__pred);
        local_160 = iVar10;
        sVar6 = std::set<Point,_std::less<Point>,_std::allocator<Point>_>::size
                          ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_a8);
      } while (sVar6 != 1);
      poVar8 = std::operator<<((ostream *)&std::cout,reselect_local._7_1_);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      local_168._M_node =
           (_Base_ptr)
           std::set<Point,_std::less<Point>,_std::allocator<Point>_>::begin
                     ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_a8);
      pPVar9 = std::_Rb_tree_const_iterator<Point>::operator*(&local_168);
      options_local._4_4_ = *pPVar9;
    }
LAB_0012cdfd:
    local_b8 = 1;
    std::set<Point,_std::less<Point>,_std::allocator<Point>_>::~set
              ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_a8);
    std::set<Point,_std::less<Point>,_std::allocator<Point>_>::~set
              ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)
               &final_matches._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  return options_local._4_4_;
}

Assistant:

Point Local::moves_fast_match(const set<Point> &options, char input, bool &reselect, bool get) {
    reselect = false;
#if AUTOFILL
    // Only one option.
    if (options.size() == 1) {
        cout << (char) (options.begin()->get_x() + 'a') << options.begin()->get_y() + 1 << endl;
        return *options.begin();
    }
#endif // AUTOFILL

    set<Point> matches, final_matches;

    // First reduction.
    do {
        do {
            if (get) {
                input = (char) tolower(getch());
            }
            get = true;
        } while (isspace(input));

        if (input == reselect_action) {
            cout << input << endl;
            reselect = true;
            return {-1, -1};
        }

        copy_if(options.begin(), options.end(), inserter(matches, matches.end()),
                [&, input](const auto &point) {
                    return ((isdigit(input) && (point.get_y() == input - '0' - 1)) ||
                            (isalpha(input) && (point.get_x() == input - 'a')));
                });
    } while (matches.empty());

    const bool first_char = isalpha(input);
    cout << input;

#if AUTOFILL
    // Only one option left.
    if (matches.size() == 1) {
        cout << (char) (isalpha(input) ? (char) matches.begin()->get_y() + '0' + 1 :
                        (char) matches.begin()->get_x() + 'a') << endl;
        return *matches.begin();
    }
#endif // AUTOFILL

    // Second reduction.
    do {
        final_matches.clear();

        do {
            input = (char) tolower(getch());
        } while (isspace(input));

        if (input == reselect_action) {
            cout << input << endl;
            reselect = true;
            return {-1, -1};
        }

        copy_if(matches.begin(), matches.end(), inserter(final_matches, final_matches.end()),
                [&, input](const auto &point) {
                    return ((isdigit(input) && (first_char) && (point.get_y() == input - '0' - 1)) ||
                            (isalpha(input) && (!first_char) && (point.get_x() == input - 'a')));
                });
    } while (final_matches.size() != 1);

    cout << input << endl;

    // Final match.
    return *final_matches.begin();
}